

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP5Deserializer::BreakdownV1ArrayName
          (BP5Deserializer *this,char *Name,char **base_name_p,DataType *type_p,int *element_size_p,
          bool *Operator,bool *MinMax)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int Len;
  int ElementSize;
  int Type;
  int *local_48;
  DataType *local_40;
  char **local_38;
  
  local_48 = element_size_p;
  local_40 = type_p;
  local_38 = base_name_p;
  pcVar2 = strchr(Name + 4,0x5f);
  pcVar2 = strchr(pcVar2 + 1,0x5f);
  __isoc99_sscanf(Name + 4,"%d_%d",&ElementSize,&Type);
  pcVar3 = strchr(Name,0x2b);
  *MinMax = false;
  while ((pcVar3 != (char *)0x0 && (*pcVar3 == '+'))) {
    iVar1 = __isoc99_sscanf(pcVar3,"+%dO",&Len);
    if (iVar1 == 1) {
      *Operator = true;
      pcVar3 = strchr(pcVar3,0x4f);
      pcVar3 = pcVar3 + (long)Len + 1;
    }
    else if (((*pcVar3 == '+') && (pcVar3[1] == 'M')) && (pcVar3[2] == 'M')) {
      *MinMax = true;
      pcVar3 = pcVar3 + 3;
    }
  }
  *local_48 = ElementSize;
  *local_40 = Type;
  pcVar2 = strdup(pcVar2 + 1);
  *local_38 = pcVar2;
  pcVar2 = strrchr(pcVar2,0x5f);
  *pcVar2 = '\0';
  return;
}

Assistant:

void BP5Deserializer::BreakdownV1ArrayName(const char *Name, char **base_name_p, DataType *type_p,
                                           int *element_size_p, bool &Operator, bool &MinMax)
{
    int Type;
    int ElementSize;

    const char *NameStart = strchr(strchr(Name + 4, '_') + 1, '_') + 1;
    // + 3 to skip BP5_ or bp5_ prefix
    sscanf(Name + 4, "%d_%d", &ElementSize, &Type);
    const char *Plus = strchr(Name, '+');
    MinMax = false;
    while (Plus && (*Plus == '+'))
    {
        int Len;
        if (sscanf(Plus, "+%dO", &Len) == 1)
        { // Operator Spec
            Operator = true;
            const char *OpStart = strchr(Plus, 'O') + 1;
            Plus = OpStart + Len;
        }
        else if (strncmp(Plus, "+MM", 3) == 0)
        {
            MinMax = true;
            Plus += 3;
        }
    }
    *element_size_p = ElementSize;
    *type_p = (DataType)Type;
    *base_name_p = strdup(NameStart);
    *(strrchr(*base_name_p, '_')) = 0;
}